

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3Fts5Strndup(int *pRc,char *pIn,int nIn)

{
  size_t sVar1;
  int in_EDX;
  char *in_RSI;
  int *in_RDI;
  char *zRet;
  int in_stack_ffffffffffffffdc;
  char *local_20;
  int local_14;
  
  local_20 = (char *)0x0;
  if (*in_RDI == 0) {
    local_14 = in_EDX;
    if (in_EDX < 0) {
      sVar1 = strlen(in_RSI);
      local_14 = (int)sVar1;
    }
    local_20 = (char *)sqlite3_malloc(in_stack_ffffffffffffffdc);
    if (local_20 == (char *)0x0) {
      *in_RDI = 7;
    }
    else {
      memcpy(local_20,in_RSI,(long)local_14);
      local_20[local_14] = '\0';
    }
  }
  return local_20;
}

Assistant:

static char *sqlite3Fts5Strndup(int *pRc, const char *pIn, int nIn){
  char *zRet = 0;
  if( *pRc==SQLITE_OK ){
    if( nIn<0 ){
      nIn = (int)strlen(pIn);
    }
    zRet = (char*)sqlite3_malloc(nIn+1);
    if( zRet ){
      memcpy(zRet, pIn, nIn);
      zRet[nIn] = '\0';
    }else{
      *pRc = SQLITE_NOMEM;
    }
  }
  return zRet;
}